

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.hh
# Opt level: O0

void __thiscall avro::Node::addName(Node *this,string *name)

{
  undefined8 in_RSI;
  Name *in_RDI;
  string *in_stack_ffffffffffffffa8;
  Name *in_stack_ffffffffffffffb0;
  Node *in_stack_ffffffffffffffd0;
  
  checkLock(in_stack_ffffffffffffffd0);
  Name::Name(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  (**(code **)(*(long *)&in_RDI->ns_ + 0x80))(in_RDI,&stack0xffffffffffffffb0);
  Name::~Name(in_RDI);
  (**(code **)(*(long *)&in_RDI->ns_ + 0x98))(in_RDI,in_RSI);
  return;
}

Assistant:

void addName(const std::string &name) {
        checkLock();
        checkName(name);
        doAddName(name);
    }